

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void get_blk_var_dev(int16_t *data,int stride,int bw,int bh,float *dev_of_mean,float *var_of_vars)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar1;
  float fVar2;
  float mean_var;
  float av_mean;
  float block_var;
  float lvl0_mean;
  float var;
  float mean;
  int64_t x2_sum;
  int x_sum;
  int col;
  int row;
  double mean2_sum;
  double var2_sum;
  float mean_sum;
  float var_sum;
  int blk_idx;
  int64_t total_x2_sum;
  int total_x_sum;
  int sub_num;
  int num;
  int subw;
  int subh;
  int16_t *data_ptr;
  int local_a8;
  int local_a4;
  float in_stack_ffffffffffffff74;
  long local_88;
  int local_7c;
  int local_78;
  int local_74;
  double local_70;
  double local_68;
  float local_5c;
  float local_58;
  int local_54;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  float *local_28;
  float *local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_a4 = in_ECX;
  if (in_EDX <= in_ECX) {
    local_a4 = in_ECX >> 1;
  }
  local_34 = local_a4;
  local_a8 = in_EDX;
  if (in_ECX <= in_EDX) {
    local_a8 = in_EDX >> 1;
  }
  local_38 = local_a8;
  local_3c = in_EDX * in_ECX;
  local_40 = local_a8 * local_a4;
  local_44 = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0.0;
  local_5c = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_30 = in_RDI;
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  for (local_74 = 0; local_74 < local_14; local_74 = local_34 + local_74) {
    for (local_78 = 0; local_78 < local_10; local_78 = local_38 + local_78) {
      (*aom_get_blk_sse_sum)
                ((int16_t *)(local_30 + (long)(local_74 * local_c) * 2 + (long)local_78 * 2),local_c
                 ,local_38,local_34,&local_7c,&local_88);
      local_44 = local_7c + local_44;
      local_50 = local_88 + local_50;
      in_stack_ffffffffffffff74 = (float)local_7c / (float)local_40;
      fVar1 = get_var(in_stack_ffffffffffffff74,(double)local_88,local_40);
      local_5c = in_stack_ffffffffffffff74 + local_5c;
      local_70 = (double)(in_stack_ffffffffffffff74 * in_stack_ffffffffffffff74) + local_70;
      local_58 = fVar1 + local_58;
      local_68 = (double)(fVar1 * fVar1) + local_68;
      local_54 = local_54 + 1;
    }
  }
  fVar1 = (float)local_44 / (float)local_3c;
  fVar2 = get_var(fVar1,(double)local_50,local_3c);
  local_5c = fVar1 + local_5c;
  local_70 = (double)(fVar1 * fVar1) + local_70;
  local_58 = fVar2 + local_58;
  local_68 = (double)(fVar2 * fVar2) + local_68;
  if (1 < local_54) {
    fVar1 = get_dev(in_stack_ffffffffffffff74,(double)CONCAT44(fVar1,fVar2),(int)(local_5c / 5.0));
    *local_20 = fVar1;
    fVar1 = get_var(local_58 / (float)(local_54 + 1),local_68,local_54 + 1);
    *local_28 = fVar1;
  }
  return;
}

Assistant:

static inline void get_blk_var_dev(const int16_t *data, int stride, int bw,
                                   int bh, float *dev_of_mean,
                                   float *var_of_vars) {
  const int16_t *const data_ptr = &data[0];
  const int subh = (bh >= bw) ? (bh >> 1) : bh;
  const int subw = (bw >= bh) ? (bw >> 1) : bw;
  const int num = bw * bh;
  const int sub_num = subw * subh;
  int total_x_sum = 0;
  int64_t total_x2_sum = 0;
  int blk_idx = 0;
  float var_sum = 0.0f;
  float mean_sum = 0.0f;
  double var2_sum = 0.0f;
  double mean2_sum = 0.0f;

  for (int row = 0; row < bh; row += subh) {
    for (int col = 0; col < bw; col += subw) {
      int x_sum;
      int64_t x2_sum;
      aom_get_blk_sse_sum(data_ptr + row * stride + col, stride, subw, subh,
                          &x_sum, &x2_sum);
      total_x_sum += x_sum;
      total_x2_sum += x2_sum;

      const float mean = (float)x_sum / sub_num;
      const float var = get_var(mean, (double)x2_sum, sub_num);
      mean_sum += mean;
      mean2_sum += (double)(mean * mean);
      var_sum += var;
      var2_sum += var * var;
      blk_idx++;
    }
  }

  const float lvl0_mean = (float)total_x_sum / num;
  const float block_var = get_var(lvl0_mean, (double)total_x2_sum, num);
  mean_sum += lvl0_mean;
  mean2_sum += (double)(lvl0_mean * lvl0_mean);
  var_sum += block_var;
  var2_sum += block_var * block_var;
  const float av_mean = mean_sum / 5;

  if (blk_idx > 1) {
    // Deviation of means.
    *dev_of_mean = get_dev(av_mean, mean2_sum, (blk_idx + 1));
    // Variance of variances.
    const float mean_var = var_sum / (blk_idx + 1);
    *var_of_vars = get_var(mean_var, var2_sum, (blk_idx + 1));
  }
}